

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::anon_unknown_0::DirectDecodeString
                   (string *__return_storage_ptr__,string *str)

{
  string *str_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\0');
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)str);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\0');
  return __return_storage_ptr__;
}

Assistant:

string DirectDecodeString(const string& str) {
  string result;
  result += (char)'\0';  // Marker for full string.
  result += str;
  result += (char)'\0';  // End of string.
  return result;
}